

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O0

void enterBlock(vm *v,byte op_code,func_type bt,vec *instructions)

{
  uint64 uVar1;
  control_frame val;
  control_frame *pcVar2;
  undefined7 uStack_67;
  control_frame cf;
  vec *instructions_local;
  byte op_code_local;
  vm *v_local;
  
  uVar1 = (v->operandStack).size;
  cf.pc._0_4_ = 0;
  if (((op_code == '\x02') || (op_code == '\x03')) || (op_code == '\x04')) {
    pcVar2 = get_top_control_stack_ele_p(&v->controlStack);
    cf.pc._0_4_ = pcVar2->depth + 1;
  }
  val._68_4_ = cf.pc._4_4_;
  val.depth = (int)cf.pc;
  val._1_7_ = uStack_67;
  val.opcode = op_code;
  val.instructions = instructions;
  val.block_type._0_8_ = bt._0_8_;
  val.block_type.param_types = bt.param_types;
  val.block_type.return_count = bt.return_count;
  val.block_type._20_4_ = bt._20_4_;
  val.block_type.return_types = bt.return_types;
  val.bp = uVar1 - bt.param_count;
  val.pc = 0;
  push_control_stack(&v->controlStack,val);
  return;
}

Assistant:

void enterBlock(vm *v, byte op_code, func_type bt, vec *instructions) {
    control_frame cf = {
            .opcode = op_code,
            .instructions = instructions,
            .block_type = bt,
            .bp = v->operandStack.size - bt.param_count,
            .pc = 0,
            .depth=0
    };
    if (cf.opcode == Block || cf.opcode == Loop || cf.opcode == If) {
        cf.depth = get_top_control_stack_ele_p(&v->controlStack)->depth + 1;
    }
    push_control_stack(&v->controlStack, cf);
}